

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O3

shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(string *filename)

{
  system_declaration_t *__tmp;
  runtime_error *this;
  string *in_RSI;
  shared_ptr<tchecker::parsing::system_declaration_t> sVar1;
  pointer local_30;
  size_type local_28;
  
  (filename->_M_dataplus)._M_p = (pointer)0x0;
  filename->_M_string_length = 0;
  sVar1 = tchecker::parsing::parse_system_declaration((parsing *)&local_30,in_RSI);
  (filename->_M_dataplus)._M_p = local_30;
  filename->_M_string_length = local_28;
  if (local_30 != (pointer)0x0) {
    sVar1.super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)filename;
    return (shared_ptr<tchecker::parsing::system_declaration_t>)
           sVar1.
           super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"nullptr system declaration");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(std::string const & filename)
{
  std::shared_ptr<tchecker::parsing::system_declaration_t> sysdecl{nullptr};
  try {
    sysdecl = tchecker::parsing::parse_system_declaration(filename);
    if (sysdecl == nullptr)
      throw std::runtime_error("nullptr system declaration");
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << e.what() << std::endl;
  }
  return sysdecl;
}